

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MessageFederateManager.cpp
# Opt level: O2

bool __thiscall helics::MessageFederateManager::hasMessage(MessageFederateManager *this)

{
  _Elt_pointer pEVar1;
  EndpointData *mq;
  _Elt_pointer pEVar2;
  _Map_pointer ppEVar3;
  _Elt_pointer pEVar4;
  shared_handle eptDat;
  shared_handle local_20;
  
  gmlc::libguarded::
  shared_guarded_opt<std::deque<helics::MessageFederateManager::EndpointData,_std::allocator<helics::MessageFederateManager::EndpointData>_>,_std::shared_mutex>
  ::lock_shared(&local_20,&this->eptData);
  pEVar2 = ((local_20.data)->
           super__Deque_base<helics::MessageFederateManager::EndpointData,_std::allocator<helics::MessageFederateManager::EndpointData>_>
           )._M_impl.super__Deque_impl_data._M_start._M_cur;
  pEVar4 = ((local_20.data)->
           super__Deque_base<helics::MessageFederateManager::EndpointData,_std::allocator<helics::MessageFederateManager::EndpointData>_>
           )._M_impl.super__Deque_impl_data._M_start._M_last;
  ppEVar3 = ((local_20.data)->
            super__Deque_base<helics::MessageFederateManager::EndpointData,_std::allocator<helics::MessageFederateManager::EndpointData>_>
            )._M_impl.super__Deque_impl_data._M_start._M_node;
  pEVar1 = ((local_20.data)->
           super__Deque_base<helics::MessageFederateManager::EndpointData,_std::allocator<helics::MessageFederateManager::EndpointData>_>
           )._M_impl.super__Deque_impl_data._M_finish._M_cur;
  while ((pEVar2 != pEVar1 && (((pEVar2->messages).queueEmptyFlag._M_base._M_i & 1U) != 0))) {
    pEVar2 = pEVar2 + 1;
    if (pEVar2 == pEVar4) {
      pEVar2 = ppEVar3[1];
      ppEVar3 = ppEVar3 + 1;
      pEVar4 = pEVar2 + 3;
    }
  }
  std::shared_lock<std::shared_mutex>::~shared_lock(&local_20.m_handle_lock);
  return pEVar2 != pEVar1;
}

Assistant:

bool MessageFederateManager::hasMessage() const
{
    auto eptDat = eptData.lock_shared();
    for (const auto& mq : eptDat) {
        if (!mq.messages.empty()) {
            return true;
        }
    }
    return false;
}